

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

ArrayXZ * __thiscall IMLE::getMultiplePredictionErrorReductionDerivative(IMLE *this)

{
  XZ *other;
  double *pdVar1;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  pointer pFVar11;
  double *pdVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Scal SVar15;
  double dVar16;
  double dVar17;
  undefined8 *puVar18;
  Index index;
  ulong uVar19;
  ulong uVar20;
  Index index_2;
  long lVar21;
  pointer pMVar22;
  Index dstRows;
  pointer pMVar23;
  ActualDstType actualDst_2;
  long lVar24;
  double dVar25;
  long lVar26;
  X invRjSqPsij;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ArrayX sumInvRjSqPsijGammaj;
  ArrayXZ sumInvRjSqPsijGammajZetaj;
  ArrayXZ sumInvRjSqPsijDelta_dGammaj;
  assign_op<double,_double> local_169;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_168;
  double local_150;
  long local_148;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_140;
  undefined1 local_120 [8];
  undefined1 local_118 [24];
  Mat *pMStack_100;
  double *local_f8;
  scalar_constant_op<double> local_f0;
  long lStack_e8;
  double *local_e0;
  Index IStack_d8;
  DstEvaluatorType local_d0;
  Mat *local_c0;
  Z *local_b8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b0;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_80;
  double local_68;
  undefined8 uStack_60;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  if (this->hasPredErrorReductionDrvt == false) {
    if (this->hasPredJacobian == false) {
      getMultiplePredictionsJacobian(this);
    }
    pMVar7 = (this->predictionsErrorReduction).
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar8 = (this->predictionsErrorReduction).
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar22 = pMVar7;
    if (pMVar8 != pMVar7) {
      do {
        free((pMVar22->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data);
        pMVar22 = pMVar22 + 1;
      } while (pMVar22 != pMVar8);
      (this->predictionsErrorReduction).
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar7;
    }
    pMVar9 = (this->predictionsErrorReductionJacobian).
             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar10 = (this->predictionsErrorReductionJacobian).
              super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pMVar23 = pMVar9;
    if (pMVar10 != pMVar9) {
      do {
        free((pMVar23->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data);
        pMVar23 = pMVar23 + 1;
      } while (pMVar23 != pMVar10);
      (this->predictionsErrorReductionJacobian).
      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar9;
    }
    iVar6 = this->nSolFound;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)&this->zeroX);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::resize(&this->predictionsErrorReduction,(long)iVar6,(value_type *)&local_58);
    free(local_58.m_data);
    iVar6 = this->nSolFound;
    other = &this->zeroXZ;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)other);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize(&this->predictionsErrorReductionJacobian,(long)iVar6,(value_type *)&local_48);
    free(local_48.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_80,(long)this->nSolFound,other,(allocator_type *)local_120);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::vector(&local_b0,(long)this->nSolFound,&this->zeroX,(allocator_type *)local_120);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector(&local_98,(long)this->nSolFound,other,(allocator_type *)local_120);
    if (this->M < 1) {
      local_150 = 0.0;
    }
    else {
      local_150 = 0.0;
      lVar24 = 0x168;
      lVar26 = 0;
      do {
        pFVar11 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        SVar15 = LinearExpert::queryHafterZ
                           ((LinearExpert *)((long)pFVar11 + lVar24 + -0x168),
                            (X *)((long)&(pFVar11->super_LinearExpert).d + lVar24));
        local_150 = local_150 + SVar15;
        lVar26 = lVar26 + 1;
        lVar24 = lVar24 + 0x308;
      } while (lVar26 < this->M);
    }
    local_168.m_storage.m_data = (double *)0x0;
    local_168.m_storage.m_rows = 0;
    if (0 < this->M) {
      local_b8 = &this->zQuery;
      local_c0 = &this->zeta;
      local_148 = 0;
      dVar25 = 0.0;
      do {
        pFVar11 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        FastLinearExpert::queryNewPredXVar
                  (pFVar11 + (long)dVar25,local_b8,
                   pFVar11[(long)dVar25].super_LinearExpert.h / local_150);
        pdVar12 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar20 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        local_68 = (this->experts).
                   super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   .
                   super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)dVar25].super_LinearExpert.p_z_T
                   / (this->varPhiAuxj).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [(long)dVar25];
        uStack_60 = 0;
        if (local_168.m_storage.m_rows != uVar20) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_168,uVar20,1);
        }
        uVar19 = local_168.m_storage.m_rows - (local_168.m_storage.m_rows >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < local_168.m_storage.m_rows) {
          lVar24 = 0;
          do {
            pdVar1 = (double *)((long)pdVar12 + lVar24 * 8 + uVar20 * local_148);
            dVar16 = pdVar1[1];
            local_168.m_storage.m_data[lVar24] = *pdVar1 * local_68;
            (local_168.m_storage.m_data + lVar24)[1] = dVar16 * local_68;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar19);
        }
        if ((long)uVar19 < local_168.m_storage.m_rows) {
          do {
            local_168.m_storage.m_data[uVar19] =
                 *(double *)((long)pdVar12 + uVar19 * 8 + uVar20 * local_148) * local_68;
            uVar19 = uVar19 + 1;
          } while (local_168.m_storage.m_rows != uVar19);
        }
        pFVar11 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_118._0_8_ = &pFVar11[(long)dVar25].super_LinearExpert.dGamma;
        local_118._8_8_ = &pFVar11[(long)dVar25].super_LinearExpert.dNewGamma;
        local_120 = (undefined1  [8])&local_168;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                  (local_80.
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)dVar25],
                   (Matrix<double,__1,_1,_0,__1,_1> *)local_120,
                   (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)(local_120 + 8),(add *)&local_140,(false_type *)&local_d0);
        pFVar11 = (this->experts).
                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  .
                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        dVar16 = pFVar11[(long)dVar25].super_LinearExpert.gamma -
                 pFVar11[(long)dVar25].super_LinearExpert.newGamma;
        uVar20 = local_168.m_storage.m_rows - (local_168.m_storage.m_rows >> 0x3f) &
                 0xfffffffffffffffe;
        if (1 < local_168.m_storage.m_rows) {
          lVar24 = 0;
          do {
            dVar17 = (local_168.m_storage.m_data + lVar24)[1];
            local_168.m_storage.m_data[lVar24] = local_168.m_storage.m_data[lVar24] * dVar16;
            (local_168.m_storage.m_data + lVar24)[1] = dVar17 * dVar16;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar20);
        }
        if ((long)uVar20 < local_168.m_storage.m_rows) {
          do {
            local_168.m_storage.m_data[uVar20] = local_168.m_storage.m_data[uVar20] * dVar16;
            uVar20 = uVar20 + 1;
          } while (local_168.m_storage.m_rows != uVar20);
        }
        iVar6 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)dVar25];
        pdVar12 = local_b0.
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar6].
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        uVar20 = local_b0.
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar6].
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        uVar19 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar20) {
          lVar24 = 0;
          do {
            dVar16 = (local_168.m_storage.m_data + lVar24)[1] + (pdVar12 + lVar24)[1];
            auVar13._8_4_ = SUB84(dVar16,0);
            auVar13._0_8_ = local_168.m_storage.m_data[lVar24] + pdVar12[lVar24];
            auVar13._12_4_ = (int)((ulong)dVar16 >> 0x20);
            *(undefined1 (*) [16])(pdVar12 + lVar24) = auVar13;
            lVar24 = lVar24 + 2;
          } while (lVar24 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar20) {
          do {
            pdVar12[uVar19] = local_168.m_storage.m_data[uVar19] + pdVar12[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        local_118._8_8_ =
             (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_rows;
        local_118._0_8_ =
             (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_data + local_118._8_8_ * (long)dVar25;
        local_120 = (undefined1  [8])&local_168;
        pMStack_100 = local_c0;
        local_f8 = (double *)0x0;
        local_f0.m_other = dVar25;
        lStack_e8 = local_118._8_8_;
        Eigen::internal::
        outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
                  (local_98.
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)dVar25],
                   (Matrix<double,__1,_1,_0,__1,_1> *)local_120,
                   (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)(local_120 + 8),(add *)&local_140,(false_type *)&local_d0);
        dVar25 = (double)((long)dVar25 + 1);
        local_148 = local_148 + 8;
      } while ((long)dVar25 < (long)this->M);
    }
    if (0 < this->nSolFound) {
      lVar24 = 0;
      do {
        dVar25 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar24];
        if ((dVar25 != 0.0) || (NAN(dVar25))) {
          pMVar7 = (this->predictionsErrorReduction).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar2 = &pMVar7[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          lVar26 = (long)(this->predictionsVar).
                         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar24].
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
          pdVar12 = local_b0.
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar24].
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          lVar21 = local_b0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar24].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (pMVar7[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != lVar21) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(pPVar2,lVar21,1)
            ;
          }
          pdVar1 = (pPVar2->m_storage).m_data;
          uVar20 = (pPVar2->m_storage).m_rows;
          uVar19 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar20) {
            lVar21 = 0;
            do {
              pdVar5 = (double *)(lVar26 + lVar21 * 8);
              dVar16 = *pdVar5;
              dVar25 = pdVar5[1];
              pdVar5 = pdVar12 + lVar21;
              dVar25 = dVar25 * dVar25 * pdVar5[1];
              auVar14._8_4_ = SUB84(dVar25,0);
              auVar14._0_8_ = dVar16 * dVar16 * *pdVar5;
              auVar14._12_4_ = (int)((ulong)dVar25 >> 0x20);
              *(undefined1 (*) [16])(pdVar1 + lVar21) = auVar14;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)uVar19);
          }
          if ((long)uVar19 < (long)uVar20) {
            do {
              dVar25 = *(double *)(lVar26 + uVar19 * 8);
              pdVar1[uVar19] = dVar25 * dVar25 * pdVar12[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar20 != uVar19);
          }
          pMVar9 = (this->predictionsVarJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (this->predictionsErrorReductionJacobian).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar10 + lVar24);
          local_118._0_8_ = (double *)0x4000000000000000;
          pMStack_100 = (Mat *)(this->predictionsVar).
                               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar24].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_data;
          local_f8 = local_b0.
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar24].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          local_f0.m_other =
               (double)pMVar9[lVar24].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data;
          lStack_e8 = pMVar9[lVar24].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
          lVar26 = local_b0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar24].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          lVar21 = pMVar9[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pMVar10[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows != lVar26) ||
             (pMVar10[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar21)) {
            if ((lVar26 != 0) &&
               ((lVar21 != 0 &&
                (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
                SUB168(auVar13 / SEXT816(lVar21),0) < lVar26)))) {
              puVar18 = (undefined8 *)
                        __cxa_allocate_exception(8,pMVar9,SUB168(auVar13 % SEXT816(lVar21),0));
              *puVar18 = operator_delete;
              __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar3,lVar21 * lVar26,lVar26,lVar21)
            ;
          }
          local_d0.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          data = pDVar3->m_data;
          local_d0.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          m_outerStride = pDVar3->m_rows;
          local_140.m_dst = &local_d0;
          local_140.m_src = (SrcEvaluatorType *)local_120;
          local_140.m_functor = (add_assign_op<double,_double> *)&local_169;
          local_140.m_dstExpr = (DstXprType *)pDVar3;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)&local_140);
          pMVar9 = (this->predictionsErrorReductionJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_140.m_dstExpr = pMVar9 + lVar24;
          local_118._0_8_ =
               (this->predictionsVar).
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_118._16_8_ =
               local_80.
               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24].
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
          pMStack_100 = (Mat *)local_80.
                               super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar24].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows;
          local_f0.m_other = 2.0;
          local_e0 = local_98.
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar24].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
          IStack_d8 = local_98.
                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar24].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
          pMVar9 = pMVar9 + lVar24;
          local_d0.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          data = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
          local_d0.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          m_outerStride =
               (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
          local_140.m_dst = &local_d0;
          local_140.m_src = (SrcEvaluatorType *)local_120;
          local_140.m_functor = (add_assign_op<double,_double> *)&local_169;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
          ::run(&local_140);
        }
        else {
          pMVar7 = (this->predictionsErrorReduction).
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
          pPVar2 = &pMVar7[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
          lVar26 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (pMVar7[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != lVar26) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(pPVar2,lVar26,1)
            ;
          }
          pdVar1 = (pPVar2->m_storage).m_data;
          uVar20 = (pPVar2->m_storage).m_rows;
          uVar19 = uVar20 - ((long)uVar20 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar20) {
            lVar26 = 0;
            do {
              pdVar5 = pdVar12 + lVar26;
              dVar25 = pdVar5[1];
              pdVar4 = pdVar1 + lVar26;
              *pdVar4 = *pdVar5;
              pdVar4[1] = dVar25;
              lVar26 = lVar26 + 2;
            } while (lVar26 < (long)uVar19);
          }
          if ((long)uVar19 < (long)uVar20) {
            do {
              pdVar1[uVar19] = pdVar12[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar20 != uVar19);
          }
          pMVar9 = (this->predictionsErrorReductionJacobian).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar12 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
          pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)(pMVar9 + lVar24);
          lVar26 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          lVar21 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
          if ((pDVar3->m_rows != lVar26) ||
             (pMVar9[lVar24].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols != lVar21)) {
            if ((lVar21 != 0 && lVar26 != 0) &&
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar21),0) <
                lVar26)) {
              puVar18 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar18 = operator_delete;
              __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar3,lVar21 * lVar26,lVar26,lVar21)
            ;
          }
          pdVar1 = pDVar3->m_data;
          lVar26 = pDVar3->m_cols * pDVar3->m_rows;
          uVar20 = lVar26 - (lVar26 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < lVar26) {
            lVar21 = 0;
            do {
              pdVar5 = pdVar12 + lVar21;
              dVar25 = pdVar5[1];
              pdVar4 = pdVar1 + lVar21;
              *pdVar4 = *pdVar5;
              pdVar4[1] = dVar25;
              lVar21 = lVar21 + 2;
            } while (lVar21 < (long)uVar20);
          }
          if ((long)uVar20 < lVar26) {
            do {
              pdVar1[uVar20] = pdVar12[uVar20];
              uVar20 = uVar20 + 1;
            } while (lVar26 - uVar20 != 0);
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < this->nSolFound);
    }
    this->hasPredErrorReductionDrvt = true;
    free(local_168.m_storage.m_data);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_98);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_b0);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&local_80);
  }
  return &this->predictionsErrorReductionJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionErrorReductionDerivative()
{
    if( !hasPredErrorReductionDrvt )
    {
        if( !hasPredJacobian )
            getMultiplePredictionsJacobian();

        predictionsErrorReduction.clear();
        predictionsErrorReductionJacobian.clear();
        predictionsErrorReduction.resize(nSolFound, zeroX);
        predictionsErrorReductionJacobian.resize(nSolFound, zeroXZ);

        ArrayXZ sumInvRjSqPsijDelta_dGammaj(nSolFound, zeroXZ);
        ArrayX sumInvRjSqPsijGammaj(nSolFound, zeroX);
        ArrayXZ sumInvRjSqPsijGammajZetaj(nSolFound, zeroXZ);

        Scal sumH = 0.0;
        for(int j = 0; j < M; j++)
            sumH += experts[j].queryHafterZ( experts[j].getPredX() );

        X invRjSqPsij;
        for(int j = 0; j < M; j++)
        {
            experts[j].queryNewPredXVar( zQuery, experts[j].get_h() / sumH );

            invRjSqPsij = fInvRj.col(j) * (experts[j].get_p_z() / varPhiAuxj(j));
            sumInvRjSqPsijDelta_dGammaj[sNearest[j]].noalias() += invRjSqPsij * ( experts[j].get_dGamma() - experts[j].get_dNewGamma() ).transpose();

            invRjSqPsij *= ( experts[j].getGamma() - experts[j].getNewGamma() ); //Using the same variable just to save resources...
            sumInvRjSqPsijGammaj[sNearest[j]] += invRjSqPsij;
            sumInvRjSqPsijGammajZetaj[sNearest[j]].noalias() += invRjSqPsij * zeta.col(j).transpose();
        }

       for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsErrorReduction[k] = zeroX;
                predictionsErrorReductionJacobian[k] = zeroXZ;
            }
            else
            {
                predictionsErrorReduction[k].noalias() = (predictionsVar[k].cwiseAbs2()).cwiseProduct(sumInvRjSqPsijGammaj[k]);
                predictionsErrorReductionJacobian[k].noalias() = (2.0*predictionsVar[k].cwiseProduct(sumInvRjSqPsijGammaj[k])).asDiagonal() * predictionsVarJacobian[k];
                predictionsErrorReductionJacobian[k].noalias() += predictionsVar[k].cwiseAbs2().asDiagonal() * (sumInvRjSqPsijDelta_dGammaj[k] - 2.0*sumInvRjSqPsijGammajZetaj[k]);
            }

        hasPredErrorReductionDrvt = true;
    }

    return predictionsErrorReductionJacobian;
}